

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_time.c
# Opt level: O1

void x_time_setup(void)

{
  t_symbol *ptVar1;
  _class *p_Var2;
  
  ptVar1 = gensym("delay");
  delay_class = class_new(ptVar1,delay_new,delay_free,0x40,0,A_DEFFLOAT,6,7,0);
  ptVar1 = gensym("del");
  class_addcreator(delay_new,ptVar1,A_DEFFLOAT,6,7,0);
  class_addbang(delay_class,delay_bang);
  p_Var2 = delay_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,delay_stop,ptVar1,A_NULL);
  p_Var2 = delay_class;
  ptVar1 = gensym("ft1");
  class_addmethod(p_Var2,delay_ft1,ptVar1,A_FLOAT,0);
  p_Var2 = delay_class;
  ptVar1 = gensym("tempo");
  class_addmethod(p_Var2,delay_tempo,ptVar1,A_FLOAT,2,0);
  class_doaddfloat(delay_class,delay_float);
  ptVar1 = gensym("metro");
  metro_class = class_new(ptVar1,metro_new,metro_free,0x48,0,A_DEFFLOAT,6,7,0);
  class_addbang(metro_class,metro_bang);
  p_Var2 = metro_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,metro_stop,ptVar1,A_NULL);
  p_Var2 = metro_class;
  ptVar1 = gensym("ft1");
  class_addmethod(p_Var2,metro_ft1,ptVar1,A_FLOAT,0);
  p_Var2 = metro_class;
  ptVar1 = gensym("tempo");
  class_addmethod(p_Var2,metro_tempo,ptVar1,A_FLOAT,2,0);
  class_doaddfloat(metro_class,metro_float);
  ptVar1 = gensym("line");
  p_Var2 = class_new(ptVar1,line_new,line_free,0x70,0,A_DEFFLOAT,6,0);
  line_class = p_Var2;
  ptVar1 = gensym("ft1");
  class_addmethod(p_Var2,line_ft1,ptVar1,A_FLOAT);
  p_Var2 = line_class;
  ptVar1 = gensym("stop");
  class_addmethod(p_Var2,line_stop,ptVar1,A_NULL);
  p_Var2 = line_class;
  ptVar1 = gensym("set");
  class_addmethod(p_Var2,line_set,ptVar1,A_FLOAT);
  class_doaddfloat(line_class,line_float);
  ptVar1 = gensym("timer");
  timer_class = class_new(ptVar1,timer_new,(t_method)0x0,0x48,0,A_DEFFLOAT,7,0);
  class_addbang(timer_class,timer_bang);
  p_Var2 = timer_class;
  ptVar1 = gensym("bang2");
  class_addmethod(p_Var2,timer_bang2,ptVar1,A_NULL);
  p_Var2 = timer_class;
  ptVar1 = gensym("tempo");
  class_addmethod(p_Var2,timer_tempo,ptVar1,A_FLOAT,2,0);
  ptVar1 = gensym("pipe");
  pipe_class = class_new(ptVar1,pipe_new,pipe_free,0x58,0,A_GIMME,0);
  class_addlist(pipe_class,pipe_list);
  p_Var2 = pipe_class;
  ptVar1 = gensym("flush");
  class_addmethod(p_Var2,pipe_flush,ptVar1,A_NULL);
  p_Var2 = pipe_class;
  ptVar1 = gensym("clear");
  class_addmethod(p_Var2,pipe_clear,ptVar1,A_NULL);
  return;
}

Assistant:

static void delay_setup(void)
{
    delay_class = class_new(gensym("delay"), (t_newmethod)delay_new,
        (t_method)delay_free, sizeof(t_delay), 0,
            A_DEFFLOAT, A_DEFFLOAT, A_DEFSYM, 0);
    class_addcreator((t_newmethod)delay_new, gensym("del"),
        A_DEFFLOAT, A_DEFFLOAT, A_DEFSYM, 0);
    class_addbang(delay_class, delay_bang);
    class_addmethod(delay_class, (t_method)delay_stop, gensym("stop"), 0);
    class_addmethod(delay_class, (t_method)delay_ft1,
        gensym("ft1"), A_FLOAT, 0);
    class_addmethod(delay_class, (t_method)delay_tempo,
        gensym("tempo"), A_FLOAT, A_SYMBOL, 0);
    class_addfloat(delay_class, (t_method)delay_float);
}